

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
write_decimal<unsigned_long_long>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this,
          unsigned_long_long value)

{
  basic_buffer<char> *pbVar1;
  size_t sVar2;
  bool bVar3;
  long lVar4;
  byte bVar5;
  ulong uVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  
  lVar4 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
    }
  }
  uVar8 = ((uint)lVar4 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  uVar9 = (ulong)((uVar8 - (value < *(ulong *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_64 +
                                              (ulong)uVar8 * 8))) + 1);
  pbVar1 = (this->out_).container;
  sVar2 = pbVar1->size_;
  uVar6 = sVar2 + uVar9;
  if (pbVar1->capacity_ < uVar6) {
    (**pbVar1->_vptr_basic_buffer)(pbVar1,uVar6);
  }
  pbVar1->size_ = uVar6;
  pcVar7 = pbVar1->ptr_ + uVar9 + sVar2;
  uVar6 = value;
  if (99 < value) {
    do {
      value = uVar6 / 100;
      *(undefined2 *)(pcVar7 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uint)((int)uVar6 + (int)value * -100) * 2)
      ;
      pcVar7 = pcVar7 + -2;
      bVar3 = 9999 < uVar6;
      uVar6 = value;
    } while (bVar3);
  }
  if (value < 10) {
    bVar5 = (byte)value | 0x30;
    lVar4 = -1;
  }
  else {
    pcVar7[-1] = internal::basic_data<void>::DIGITS[(value * 2 & 0xffffffff) + 1];
    bVar5 = internal::basic_data<void>::DIGITS[value * 2 & 0x1fffffffe];
    lVar4 = -2;
  }
  pcVar7[lVar4] = bVar5;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    unsigned num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + num_digits);
    if (is_negative)
      *it++ = '-';
    it = internal::format_decimal(it, abs_value, num_digits);
  }